

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_alltoall_single(bsc_step_t depends,bsc_group_t group,void *src,void *dst,bsc_size_t size)

{
  bsc_pid_t dst_pid;
  undefined4 local_5c;
  undefined4 local_54;
  bsc_size_t doff;
  bsc_pid_t m;
  char *src_bytes;
  bsp_pid_t P;
  bsp_pid_t i;
  group_t *g;
  bsc_size_t size_local;
  void *dst_local;
  void *src_local;
  bsc_group_t group_local;
  bsc_step_t depends_local;
  
  if (group == (bsc_group_t)0x0) {
    local_54 = bsp_nprocs();
  }
  else {
    local_54 = *group;
  }
  for (src_bytes._4_4_ = 0; src_bytes._4_4_ < local_54; src_bytes._4_4_ = src_bytes._4_4_ + 1) {
    if (group == (bsc_group_t)0x0) {
      local_5c = bsp_pid();
      dst_pid = src_bytes._4_4_;
    }
    else {
      local_5c = *(int *)(*(long *)((long)group + 0x18) + (long)src_bytes._4_4_ * 4);
      dst_pid = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)src_bytes._4_4_ * 4);
    }
    bsc_put(depends,dst_pid,(void *)((long)src + (long)(src_bytes._4_4_ * size)),dst,local_5c * size
            ,size);
  }
  return depends + 1;
}

Assistant:

bsc_step_t bsc_alltoall_single( bsc_step_t depends, bsc_group_t group,
                      const void * src, void * dst, bsc_size_t size )
{
    const group_t * g = group;
    bsp_pid_t i, P = g?g->size:bsp_nprocs() ;
    const char * src_bytes = (const char *) src;
    for ( i = 0; i < P; ++i ) {
        bsc_pid_t m = g?g->gid[i]:i;
        bsc_size_t doff = g?g->rof[i]:bsp_pid();
        bsc_put( depends, m, src_bytes + i * size, dst, doff * size, size );
    }
    return depends + 1;
}